

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

int __thiscall Catch::Session::applyCommandLine(Session *this,int argc,char **argv)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long *plVar1;
  ostream *poVar2;
  int iVar3;
  Session *this_01;
  InternalParseResult result;
  undefined1 local_d8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  string local_a0;
  undefined1 local_80 [64];
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  iVar3 = 1;
  if (this->m_startupExceptions == false) {
    clara::detail::Args::Args((Args *)local_d8,argc,argv);
    clara::detail::ParserBase::parse
              ((InternalParseResult *)local_80,&(this->m_cli).super_ParserBase,(Args *)local_d8);
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b8);
    this_01 = (Session *)local_d8._0_8_;
    if ((Session *)local_d8._0_8_ != (Session *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    if (local_80._8_4_ == Ok) {
      if ((this->m_configData).showHelp == true) {
        this_01 = this;
        showHelp(this);
      }
      if ((this->m_configData).libIdentify == true) {
        libIdentify(this_01);
      }
      this_00 = (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      iVar3 = 0;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        iVar3 = 0;
      }
    }
    else {
      config(this);
      if (IMutableContext::currentContext == (long *)0x0) {
        IMutableContext::currentContext = (long *)operator_new(0x30);
        *IMutableContext::currentContext = 0;
        IMutableContext::currentContext[1] = 0;
        IMutableContext::currentContext[4] = 0;
        IMutableContext::currentContext[5] = 0;
        IMutableContext::currentContext[2] = 0;
        IMutableContext::currentContext[3] = 0;
        *IMutableContext::currentContext = (long)&PTR__Context_00180ec0;
        IMutableContext::currentContext[1] = (long)&PTR__Context_00180f10;
      }
      plVar1 = IMutableContext::currentContext;
      local_d8._0_8_ =
           (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_d8._8_8_ =
           (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if ((pointer)local_d8._8_8_ != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((pointer)local_d8._8_8_)->_M_string_length =
               (int)((pointer)local_d8._8_8_)->_M_string_length + 1;
          UNLOCK();
        }
        else {
          *(int *)&((pointer)local_d8._8_8_)->_M_string_length =
               (int)((pointer)local_d8._8_8_)->_M_string_length + 1;
        }
      }
      (**(code **)(*plVar1 + 0x38))(plVar1,local_d8);
      if ((pointer)local_d8._8_8_ != (pointer)0x0) {
        clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
      }
      Colour::use(Red);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\nError(s) in input:\n",0x14);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,local_40._M_p,local_40._M_p + local_38);
      clara::TextFlow::Column::Column((Column *)local_d8,&local_a0);
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
      poVar2 = clara::TextFlow::operator<<((ostream *)&std::cerr,(Column *)local_d8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\n",2);
      clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      Colour::use(None);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Run with -? for usage\n",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
      std::ostream::put(-0x40);
      std::ostream::flush();
      iVar3 = 0xff;
    }
    local_80._0_8_ = &PTR__BasicResult_00183718;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_p != &local_30) {
      operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
    }
    local_80._0_8_ = &PTR__ResultValueBase_00183770;
    if (local_80._8_4_ == Ok) {
      clara::std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
      ::~vector((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *
                )(local_80 + 0x28));
    }
  }
  return iVar3;
}

Assistant:

int Session::applyCommandLine( int argc, char const * const * argv ) {
        if( m_startupExceptions )
            return 1;

        auto result = m_cli.parse( clara::Args( argc, argv ) );
        if( !result ) {
            config();
            getCurrentMutableContext().setConfig(m_config);
            Catch::cerr()
                << Colour( Colour::Red )
                << "\nError(s) in input:\n"
                << Column( result.errorMessage() ).indent( 2 )
                << "\n\n";
            Catch::cerr() << "Run with -? for usage\n" << std::endl;
            return MaxExitCode;
        }

        if( m_configData.showHelp )
            showHelp();
        if( m_configData.libIdentify )
            libIdentify();
        m_config.reset();
        return 0;
    }